

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O0

void __thiscall
Eigen::
ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::ProductBase(ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *this,GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
                    *a_lhs,Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *a_rhs)

{
  PlainObject *pPVar1;
  Index IVar2;
  Index IVar3;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *a_rhs_local;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  *a_lhs_local;
  ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_local;
  
  MatrixBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>_>
  ::MatrixBase((MatrixBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>
                *)this);
  pPVar1 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)a_lhs);
  this->m_lhs = pPVar1;
  (this->m_rhs).m_matrix = a_rhs->m_matrix;
  Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->m_result);
  IVar2 = ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
          ::cols(&a_lhs->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                );
  IVar3 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(a_rhs);
  if (IVar2 != IVar3) {
    __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hq-jiang[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/ProductBase.h"
                  ,0x66,
                  "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>, Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>, Lhs = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  return;
}

Assistant:

ProductBase(const Lhs& a_lhs, const Rhs& a_rhs)
      : m_lhs(a_lhs), m_rhs(a_rhs)
    {
      eigen_assert(a_lhs.cols() == a_rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }